

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<int,_QSocketNotifierSetUNIX>::erase
          (QHash<int,_QSocketNotifierSetUNIX> *this,const_iterator it)

{
  Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *d;
  ulong uVar1;
  Span *pSVar2;
  uint uVar3;
  Bucket bucket;
  iterator iVar4;
  
  uVar1 = it.i.bucket;
  d = this->d;
  if ((d == (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)0x0) ||
     (1 < (uint)(d->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    d = QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::detached(d);
    this->d = d;
  }
  pSVar2 = d->spans + (uVar1 >> 7);
  uVar3 = (uint)it.i.bucket & 0x7f;
  bucket.index._0_4_ = uVar3;
  bucket.span = pSVar2;
  bucket.index._4_4_ = 0;
  QHashPrivate::Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_>::erase(d,bucket);
  if (((((ulong)((long)pSVar2 - (long)this->d->spans) >> 4) * 0x1c71c71c71c71c80 | (ulong)uVar3) ==
       this->d->numBuckets - 1) || (pSVar2->offsets[uVar3] == 0xff)) {
    do {
      if (d->numBuckets - 1 == uVar1) {
        d = (Data<QHashPrivate::Node<int,_QSocketNotifierSetUNIX>_> *)0x0;
        uVar1 = 0;
        break;
      }
      uVar1 = uVar1 + 1;
    } while (d->spans[uVar1 >> 7].offsets[(uint)uVar1 & 0x7f] == 0xff);
  }
  iVar4.i.bucket = uVar1;
  iVar4.i.d = d;
  return (iterator)iVar4.i;
}

Assistant:

iterator erase(const_iterator it)
    {
        Q_ASSERT(it != constEnd());
        detach();
        // ensure a valid iterator across the detach:
        iterator i = iterator{d->detachedIterator(it.i)};
        typename Data::Bucket bucket(i.i);

        d->erase(bucket);
        if (bucket.toBucketIndex(d) == d->numBuckets - 1 || bucket.isUnused())
            ++i;
        return i;
    }